

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O3

int lws_service_fd_tsi(lws_context *context,pollfd *pollfd,int tsi)

{
  int iVar1;
  lws_ssl_capable_status lVar2;
  lws *wsi;
  byte *pbVar3;
  
  if (context == (lws_context *)0x0) {
    return -1;
  }
  if ((context->field_0x510 & 8) != 0) {
    return -1;
  }
  if (pollfd == (pollfd *)0x0) {
    __assert_fail("pollfd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/service.c"
                  ,0x275,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)");
  }
  if (pollfd->fd == -1) {
    __assert_fail("lws_socket_is_valid(pollfd->fd)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/service.c"
                  ,0x278,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)");
  }
  wsi = wsi_from_fd(context,pollfd->fd);
  if (wsi == (lws *)0x0) {
    return 0;
  }
  if (((pollfd->revents & 0x18U) == 0) || ((pollfd->revents & pollfd->events & 1U) != 0)) {
    if (((short)wsi->wsistate == 0x1f) &&
       ((iVar1 = lws_is_ssl(wsi), iVar1 != 0 && ((wsi->tls).ssl != (lws_tls_conn *)0x0)))) {
      lVar2 = __lws_tls_shutdown(wsi);
      if (2 < (uint)(lVar2 + 4)) {
        if ((uint)(lVar2 + ~LWS_SSL_CAPABLE_MORE_SERVICE_READ) < 2) goto LAB_0011644b;
        goto LAB_0011640d;
      }
    }
    else {
LAB_0011640d:
      wsi->field_0x2e1 = wsi->field_0x2e1 & 0xfb;
      pbVar3 = (byte *)((long)&context->set + (long)tsi * 0x188 + -0x41);
      *pbVar3 = *pbVar3 | 2;
      if (wsi->role_ops == (lws_role_ops *)0x0) {
        __assert_fail("wsi->role_ops",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/service.c"
                      ,0x2ba,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)");
      }
      iVar1 = (*wsi->role_ops->handle_POLLIN)(context->pt + tsi,wsi,pollfd);
      if (iVar1 == 4) goto LAB_00116472;
      if (iVar1 != 5) {
        if (iVar1 != 6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/service.c"
                        ,0x2dd,"int lws_service_fd_tsi(struct lws_context *, struct pollfd *, int)")
          ;
        }
        goto LAB_0011644b;
      }
    }
    pollfd->revents = 0;
    iVar1 = 0;
  }
  else {
    wsi->field_0x2dd = wsi->field_0x2dd | 0x10;
    _lws_log(0x10,"Session Socket %p (fd=%d) dead\n",wsi,(ulong)(uint)pollfd->fd);
LAB_0011644b:
    _lws_log(0x10,"%p: Close and handled\n",wsi);
    lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"close_and_handled");
LAB_00116472:
    iVar1 = 1;
  }
  pbVar3 = (byte *)((long)&context->set + (long)tsi * 0x188 + -0x41);
  *pbVar3 = *pbVar3 & 0xfd;
  return iVar1;
}

Assistant:

int
lws_service_fd_tsi(struct lws_context *context, struct lws_pollfd *pollfd,
		   int tsi)
{
	struct lws_context_per_thread *pt;
	struct lws *wsi;

	if (!context || context->being_destroyed1)
		return -1;

	pt = &context->pt[tsi];

	if (!pollfd) {
		/*
		 * calling with NULL pollfd for periodic background processing
		 * is no longer needed and is now illegal.
		 */
		assert(pollfd);
		return -1;
	}
	assert(lws_socket_is_valid(pollfd->fd));

	/* no, here to service a socket descriptor */
	wsi = wsi_from_fd(context, pollfd->fd);
	if (!wsi)
		/* not lws connection ... leave revents alone and return */
		return 0;

#if LWS_MAX_SMP > 1
	if (wsi->undergoing_init_from_other_pt)
		/*
		 * Temporary situation that other service thread is initializing
		 * this wsi right now for use on our service thread.
		 */
		return 0;
#endif

	/*
	 * so that caller can tell we handled, past here we need to
	 * zero down pollfd->revents after handling
	 */

	/* handle session socket closed */

	if ((!(pollfd->revents & pollfd->events & LWS_POLLIN)) &&
	    (pollfd->revents & LWS_POLLHUP)) {
		wsi->socket_is_permanently_unusable = 1;
		lwsl_debug("Session Socket %p (fd=%d) dead\n",
			   (void *)wsi, pollfd->fd);

		goto close_and_handled;
	}

#ifdef _WIN32
	if (pollfd->revents & LWS_POLLOUT)
		wsi->sock_send_blocking = FALSE;
#endif

	if ((!(pollfd->revents & pollfd->events & LWS_POLLIN)) &&
	    (pollfd->revents & LWS_POLLHUP)) {
		lwsl_debug("pollhup\n");
		wsi->socket_is_permanently_unusable = 1;
		goto close_and_handled;
	}

#if defined(LWS_WITH_TLS)
	if (lwsi_state(wsi) == LRS_SHUTDOWN &&
	    lws_is_ssl(wsi) && wsi->tls.ssl) {
		switch (__lws_tls_shutdown(wsi)) {
		case LWS_SSL_CAPABLE_DONE:
		case LWS_SSL_CAPABLE_ERROR:
			goto close_and_handled;

		case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
		case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			goto handled;
		}
	}
#endif
	wsi->could_have_pending = 0; /* clear back-to-back write detection */
	pt->inside_lws_service = 1;

	/* okay, what we came here to do... */

	/* if we got here, we should have wire protocol ops set on the wsi */
	assert(wsi->role_ops);

	// lwsl_notice("%s: %s: wsistate 0x%x\n", __func__, wsi->role_ops->name,
	//	    wsi->wsistate);

	switch ((wsi->role_ops->handle_POLLIN)(pt, wsi, pollfd)) {
	case LWS_HPI_RET_WSI_ALREADY_DIED:
		pt->inside_lws_service = 0;
		return 1;
	case LWS_HPI_RET_HANDLED:
		break;
	case LWS_HPI_RET_PLEASE_CLOSE_ME:
close_and_handled:
		lwsl_debug("%p: Close and handled\n", wsi);
		lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
				   "close_and_handled");
#if defined(_DEBUG) && defined(LWS_WITH_LIBUV)
		/*
		 * confirm close has no problem being called again while
		 * it waits for libuv service to complete the first async
		 * close
		 */
		if (context->event_loop_ops == &event_loop_ops_uv)
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   "close_and_handled uv repeat test");
#endif
		/*
		 * pollfd may point to something else after the close
		 * due to pollfd swapping scheme on delete on some platforms
		 * we can't clear revents now because it'd be the wrong guy's
		 * revents
		 */
		pt->inside_lws_service = 0;
		return 1;
	default:
		assert(0);
	}
#if defined(LWS_WITH_TLS)
handled:
#endif
	pollfd->revents = 0;
	pt->inside_lws_service = 0;

	return 0;
}